

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O3

void __thiscall undo::UndoHistory::clearRedo(UndoHistory *this)

{
  UndoState *pUVar1;
  UndoState *pUVar2;
  UndoState *state;
  
  state = this->m_last;
  pUVar1 = this->m_cur;
  if (pUVar1 == (UndoState *)0x0) {
    this->m_first = (UndoState *)0x0;
    pUVar2 = (UndoState *)0x0;
  }
  else {
    pUVar1->m_next = (UndoState *)0x0;
    pUVar2 = this->m_cur;
  }
  this->m_last = pUVar1;
  if ((state != (UndoState *)0x0) && (state != pUVar2)) {
    do {
      pUVar1 = state->m_prev;
      deleteState(this,state);
      if (pUVar1 == (UndoState *)0x0) {
        return;
      }
      state = pUVar1;
    } while (pUVar1 != this->m_cur);
  }
  return;
}

Assistant:

void UndoHistory::clearRedo()
{
  UndoState* state = m_last;

  // First we break the chain of undo states because deleteState() can
  // generate an onDeleteUndoState() notification which might try to
  // iterate over the whole UndoHistory.
  if (m_cur) {
    m_cur->m_next = nullptr;
    m_last = m_cur;
  }
  else {
    m_first = m_last = nullptr;
  }

  for (UndoState* prev = nullptr;
       state && state != m_cur;
       state = prev) {
    prev = state->m_prev;
    deleteState(state);
  }
}